

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O3

void deqp::gles3::Functional::evalTexture2DShadowProjOffset(ShaderEvalContext *c,TexLookupParams *p)

{
  Texture2D *pTVar1;
  float fVar2;
  IVec3 local_18;
  
  fVar2 = c->in[0].m_data[3];
  pTVar1 = c->textures[0].tex2D;
  local_18.m_data._0_8_ = *(undefined8 *)(p->offset).m_data;
  local_18.m_data[2] = 0;
  fVar2 = tcu::sampleLevelArray2DCompare
                    ((pTVar1->m_view).m_levels,(pTVar1->m_view).m_numLevels,&c->textures[0].sampler,
                     c->in[0].m_data[2] / fVar2,c->in[0].m_data[0] / fVar2,
                     c->in[0].m_data[1] / fVar2,p->lod,&local_18);
  (c->color).m_data[0] = fVar2;
  return;
}

Assistant:

static void		evalTexture2DShadowProjOffset		(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture2DShadowOffset(c, c.in[0].z()/c.in[0].w(), c.in[0].x()/c.in[0].w(), c.in[0].y()/c.in[0].w(), p.lod, p.offset.swizzle(0,1)); }